

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

string * __thiscall
vkt::SpirVAssembly::getByteWidthStr_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,IntegerType type)

{
  allocator<char> *__a;
  uint uVar1;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  uVar1 = (uint)this;
  if (uVar1 < 6) {
    if ((9U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x12U >> (uVar1 & 0x1f) & 1) == 0) {
        __s = "8";
        __a = &local_b;
      }
      else {
        __s = "4";
        __a = &local_a;
      }
    }
    else {
      __s = "2";
      __a = &local_9;
    }
  }
  else {
    __s = "";
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

const string getByteWidthStr (IntegerType type)
{
	switch (type)
	{
		case INTEGER_TYPE_SIGNED_16:
		case INTEGER_TYPE_UNSIGNED_16:	return "2";

		case INTEGER_TYPE_SIGNED_32:
		case INTEGER_TYPE_UNSIGNED_32:	return "4";

		case INTEGER_TYPE_SIGNED_64:
		case INTEGER_TYPE_UNSIGNED_64:	return "8";

		default:						DE_ASSERT(false);
										return "";
	}
}